

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::MergeUpdateLoop<unsigned_short>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,row_t *ids,idx_t count,SelectionVector *sel)

{
  UpdateInfo *__dest;
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  sel_t sVar4;
  void *__dest_00;
  long lVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  anon_class_40_5_fa23cdf1 *count_00;
  ulong uVar9;
  idx_t i;
  ulong uVar10;
  size_t sVar11;
  unsigned_short *puVar12;
  idx_t id;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  unsigned_short result_values [2048];
  sel_t result_ids [2048];
  idx_t local_30b8;
  UpdateInfo *local_30b0;
  idx_t local_30a8;
  void *local_30a0;
  UpdateInfo *local_3098;
  long local_3090;
  UpdateInfo *local_3088;
  SelectionVector *local_3080;
  data_ptr_t local_3078;
  sel_t *local_3070;
  unsigned_short *local_3068;
  anon_class_40_5_fa23cdf1 local_3060;
  unsigned_short local_3038 [2048];
  sel_t local_2038 [2050];
  
  local_3078 = base_data->data;
  local_3080 = update->sel;
  local_3068 = (unsigned_short *)update->data;
  lVar7 = base_info->vector_index * 0x800 + base_info->segment->column_data->start;
  __dest = base_info + 1;
  __dest_00 = (void *)((long)&base_info[1].segment + (ulong)base_info->max * 4);
  local_3098 = update_info + 1;
  local_30a0 = (void *)((long)&update_info[1].segment + (ulong)update_info->max * 4);
  local_3090 = (ulong)update_info->max * 4;
  local_3070 = sel->sel_vector;
  uVar2 = update_info->N;
  uVar16 = (ulong)base_info->N;
  lVar8 = 0;
  uVar10 = 0;
  uVar17 = 0;
  uVar14 = 0;
  while( true ) {
    if (uVar10 == count) break;
    uVar9 = uVar10;
    if (local_3070 != (sel_t *)0x0) {
      uVar9 = (ulong)local_3070[uVar10];
    }
    uVar9 = ids[uVar9] - lVar7;
    for (lVar5 = 0; lVar5 + uVar17 < (ulong)uVar2; lVar5 = lVar5 + 1) {
      uVar3 = *(uint *)((long)&local_3098->segment + lVar5 * 4 + uVar17 * 4);
      if (uVar9 <= uVar3) {
        if (uVar9 == uVar3) {
          local_3038[lVar8 + lVar5] = *(unsigned_short *)((long)local_30a0 + lVar5 * 2 + uVar17 * 2)
          ;
          local_2038[lVar8 + lVar5] = uVar3;
          uVar15 = uVar14;
          uVar17 = lVar5 + uVar17 + 1;
          goto LAB_01aa9e9f;
        }
        break;
      }
      local_3038[lVar8 + lVar5] = *(unsigned_short *)((long)local_30a0 + lVar5 * 2 + uVar17 * 2);
      local_2038[lVar8 + lVar5] = uVar3;
    }
    uVar15 = uVar16;
    if (uVar16 < uVar14) {
      uVar15 = uVar14;
    }
    puVar12 = (unsigned_short *)((long)__dest_00 + uVar14 * 2);
    for (; uVar14 < uVar16; uVar14 = uVar14 + 1) {
      uVar13 = (ulong)*(uint *)((long)&__dest->segment + uVar14 * 4);
      if (uVar9 <= uVar13) {
        uVar15 = uVar14;
        if (uVar9 == uVar13) goto LAB_01aa9e91;
        break;
      }
      puVar12 = puVar12 + 1;
    }
    puVar12 = (unsigned_short *)(local_3078 + uVar9 * 2);
LAB_01aa9e91:
    local_3038[lVar8 + lVar5] = *puVar12;
    local_2038[lVar8 + lVar5] = (sel_t)uVar9;
    uVar17 = lVar5 + uVar17;
LAB_01aa9e9f:
    lVar8 = lVar8 + lVar5 + 1;
    uVar10 = uVar10 + 1;
    uVar14 = uVar15;
  }
  sVar11 = lVar8 * 4;
  sVar6 = lVar8 * 2;
  for (lVar5 = 0; lVar5 + uVar17 < (ulong)uVar2; lVar5 = lVar5 + 1) {
    local_3038[lVar8 + lVar5] =
         *(unsigned_short *)((long)&update_info[1].segment + lVar5 * 2 + uVar17 * 2 + local_3090);
    local_2038[lVar8 + lVar5] = *(sel_t *)((long)&update_info[1].segment + lVar5 * 4 + uVar17 * 4);
    sVar11 = sVar11 + 4;
    sVar6 = sVar6 + 2;
  }
  update_info->N = (int)lVar8 + (int)lVar5;
  local_30b0 = base_info;
  local_30a8 = count;
  local_3088 = update_info;
  switchD_016b0717::default(local_30a0,&local_3038,sVar6);
  switchD_016b0717::default(local_3098,(sel_t (*) [2048])local_2038,sVar11);
  local_3060.result_offset = &local_30b8;
  local_30b8 = 0;
  count_00 = &local_3060;
  local_3060.update_vector_data = &local_3068;
  local_3060.update_vector_sel = local_3080;
  uVar2 = local_30b0->N;
  lVar8 = 0;
  uVar17 = 0;
  uVar14 = 0;
  local_3060.result_values = &local_3038;
  local_3060.result_ids = (sel_t (*) [2048])local_2038;
  do {
    while( true ) {
      if ((count <= uVar14) || (uVar2 <= uVar17)) {
        for (; uVar14 < count; uVar14 = uVar14 + 1) {
          uVar10 = uVar14;
          if (sel->sel_vector != (sel_t *)0x0) {
            uVar10 = (ulong)sel->sel_vector[uVar14];
          }
          MergeUpdateLoopInternal<unsigned_short,_unsigned_short,_duckdb::ExtractStandardEntry>::
          anon_class_40_5_fa23cdf1::operator()
                    (&local_3060,ids[uVar10] - lVar7,uVar10,(idx_t)count_00);
        }
        sVar11 = local_30b8 * 4;
        sVar6 = local_30b8 * 2;
        for (lVar7 = 0; lVar7 + uVar17 < (ulong)uVar2; lVar7 = lVar7 + 1) {
          sVar4 = *(sel_t *)((long)&__dest->segment + lVar8 * 2);
          local_3038[local_30b8 + lVar7] = *(unsigned_short *)((long)__dest_00 + lVar8);
          local_2038[local_30b8 + lVar7] = sVar4;
          sVar11 = sVar11 + 4;
          sVar6 = sVar6 + 2;
          lVar8 = lVar8 + 2;
        }
        local_30b0->N = (int)local_30b8 + (int)lVar7;
        switchD_016b0717::default(__dest_00,local_3038,sVar6);
        switchD_016b0717::default(__dest,local_2038,sVar11);
        return;
      }
      uVar10 = uVar14;
      if (sel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)sel->sel_vector[uVar14];
      }
      id = ids[uVar10] - lVar7;
      uVar3 = *(uint *)((long)&__dest->segment + uVar17 * 4);
      if (id != uVar3) break;
      MergeUpdateLoopInternal<unsigned_short,_unsigned_short,_duckdb::ExtractStandardEntry>::
      anon_class_40_5_fa23cdf1::operator()(&local_3060,id,uVar10,(idx_t)count_00);
      uVar14 = uVar14 + 1;
LAB_01aaa005:
      uVar17 = uVar17 + 1;
      lVar8 = lVar8 + 2;
    }
    if (uVar3 <= id) {
      uVar1 = *(ushort *)((long)__dest_00 + uVar17 * 2);
      count_00 = (anon_class_40_5_fa23cdf1 *)(ulong)uVar1;
      local_3038[local_30b8] = uVar1;
      local_2038[local_30b8] = uVar3;
      local_30b8 = local_30b8 + 1;
      goto LAB_01aaa005;
    }
    MergeUpdateLoopInternal<unsigned_short,_unsigned_short,_duckdb::ExtractStandardEntry>::
    anon_class_40_5_fa23cdf1::operator()(&local_3060,id,uVar10,(idx_t)count_00);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

static void MergeUpdateLoop(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                            UnifiedVectorFormat &update, row_t *ids, idx_t count, const SelectionVector &sel) {
	auto base_table_data = FlatVector::GetData<T>(base_data);
	auto update_vector_data = update.GetData<T>(update);
	MergeUpdateLoopInternal<T, T>(base_info, base_table_data, update_info, *update.sel, update_vector_data, ids, count,
	                              sel);
}